

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_DCtx * ZSTD_initStaticDCtx(void *workspace,size_t workspaceSize)

{
  if (workspaceSize < 0x27218 || ((ulong)workspace & 7) != 0) {
    workspace = (ZSTD_DCtx *)0x0;
  }
  else {
    ZSTD_initDCtx_internal((ZSTD_DCtx *)workspace);
    *(size_t *)((long)workspace + 29000) = workspaceSize;
    *(long *)((long)workspace + 0x7178) = (long)workspace + 0x27218;
  }
  return (ZSTD_DCtx *)workspace;
}

Assistant:

ZSTD_DCtx* ZSTD_initStaticDCtx(void *workspace, size_t workspaceSize)
{
    ZSTD_DCtx* const dctx = (ZSTD_DCtx*) workspace;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */
    if (workspaceSize < sizeof(ZSTD_DCtx)) return NULL;  /* minimum size */

    ZSTD_initDCtx_internal(dctx);
    dctx->staticSize = workspaceSize;
    dctx->inBuff = (char*)(dctx+1);
    return dctx;
}